

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O3

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  secp256k1_gej *psVar4;
  secp256k1_gej *psVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  secp256k1_ge_storage local_e0;
  secp256k1_scalar local_a0;
  secp256k1_ge local_80;
  
  psVar4 = &ctx->initial;
  psVar5 = r;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (psVar5->x).n[0] = (psVar4->x).n[0];
    psVar4 = (secp256k1_gej *)((psVar4->x).n + 1);
    psVar5 = (secp256k1_gej *)((psVar5->x).n + 1);
  }
  secp256k1_scalar_add(&local_a0,gn,&ctx->blind);
  local_80.infinity = 0;
  lVar2 = 0x6c1c70;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  uVar14 = 0;
  uVar6 = 0;
  uVar15 = 0;
  uVar16 = 0;
  uVar17 = 0;
  uVar18 = 0;
  uVar19 = 0;
  uVar20 = 0;
  uVar21 = 0;
  uVar22 = 0;
  uVar23 = 0;
  uVar24 = 0;
  uVar25 = 0;
  uVar26 = 0;
  do {
    uVar3 = 0;
    do {
      uVar10 = (uint)(((uint)(local_a0.d[uVar6 >> 4 & 0xfffffff] >> ((char)uVar6 * '\x04' & 0x3fU))
                      & 0xf) << 6 == uVar3);
      uVar7 = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar8 = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar9 = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar10 = (int)(uVar10 << 0x1f) >> 0x1f;
      puVar1 = (uint *)(lVar2 + -0x10 + uVar3);
      uVar15 = ~uVar7 & uVar15 | *puVar1 & uVar7;
      uVar16 = ~uVar8 & uVar16 | puVar1[1] & uVar8;
      uVar17 = ~uVar9 & uVar17 | puVar1[2] & uVar9;
      uVar18 = ~uVar10 & uVar18 | puVar1[3] & uVar10;
      puVar1 = (uint *)(lVar2 + -0x20 + uVar3);
      uVar11 = ~uVar7 & uVar11 | *puVar1 & uVar7;
      uVar12 = ~uVar8 & uVar12 | puVar1[1] & uVar8;
      uVar13 = ~uVar9 & uVar13 | puVar1[2] & uVar9;
      uVar14 = ~uVar10 & uVar14 | puVar1[3] & uVar10;
      puVar1 = (uint *)(lVar2 + 0x10 + uVar3);
      uVar23 = ~uVar7 & uVar23 | *puVar1 & uVar7;
      uVar24 = ~uVar8 & uVar24 | puVar1[1] & uVar8;
      uVar25 = ~uVar9 & uVar25 | puVar1[2] & uVar9;
      uVar26 = ~uVar10 & uVar26 | puVar1[3] & uVar10;
      puVar1 = (uint *)(lVar2 + uVar3);
      uVar19 = ~uVar7 & uVar19 | *puVar1 & uVar7;
      uVar20 = ~uVar8 & uVar20 | puVar1[1] & uVar8;
      uVar21 = ~uVar9 & uVar21 | puVar1[2] & uVar9;
      uVar22 = ~uVar10 & uVar22 | puVar1[3] & uVar10;
      uVar3 = uVar3 + 0x40;
    } while (uVar3 != 0x400);
    local_e0.x.n[0]._0_4_ = uVar11;
    local_e0.x.n[0]._4_4_ = uVar12;
    local_e0.x.n[1]._0_4_ = uVar13;
    local_e0.x.n[1]._4_4_ = uVar14;
    local_e0.x.n[2]._0_4_ = uVar15;
    local_e0.x.n[2]._4_4_ = uVar16;
    local_e0.x.n[3]._0_4_ = uVar17;
    local_e0.x.n[3]._4_4_ = uVar18;
    local_e0.y.n[0]._0_4_ = uVar19;
    local_e0.y.n[0]._4_4_ = uVar20;
    local_e0.y.n[1]._0_4_ = uVar21;
    local_e0.y.n[1]._4_4_ = uVar22;
    local_e0.y.n[2]._0_4_ = uVar23;
    local_e0.y.n[2]._4_4_ = uVar24;
    local_e0.y.n[3]._0_4_ = uVar25;
    local_e0.y.n[3]._4_4_ = uVar26;
    secp256k1_ge_from_storage(&local_80,&local_e0);
    secp256k1_gej_add_ge(r,r,&local_80);
    uVar6 = uVar6 + 1;
    lVar2 = lVar2 + 0x400;
  } while (uVar6 != 0x40);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    int bits = ECMULT_GEN_PREC_BITS;
    int g = ECMULT_GEN_PREC_G(bits);
    int n = ECMULT_GEN_PREC_N(bits);

    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int i, j, n_i;
    
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (i = 0; i < n; i++) {
        n_i = secp256k1_scalar_get_bits(&gnb, i * bits, bits);
        for (j = 0; j < g; j++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (https://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &secp256k1_ecmult_gen_prec_table[i][j], j == n_i);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    n_i = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}